

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

uint32_t sysbvm_integer_sumInto
                   (size_t leftWordCount,uint32_t *leftWords,size_t rightWordCount,
                   uint32_t *rightWords,size_t resultWordCount,uint32_t *resultWords)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  size_t sVar5;
  ulong uVar6;
  
  sVar5 = rightWordCount;
  if (rightWordCount < leftWordCount) {
    sVar5 = leftWordCount;
  }
  if (sVar5 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar6 = 0;
    do {
      if (uVar6 < leftWordCount) {
        uVar4 = (ulong)leftWords[uVar6];
      }
      else {
        uVar4 = 0;
      }
      if (uVar6 < rightWordCount) {
        uVar2 = (ulong)rightWords[uVar6];
      }
      else {
        uVar2 = 0;
      }
      uVar2 = uVar3 + uVar4 + uVar2;
      if (uVar6 < resultWordCount) {
        resultWords[uVar6] = (uint32_t)uVar2;
      }
      uVar3 = uVar2 >> 0x20;
      uVar6 = uVar6 + 1;
    } while (sVar5 != uVar6);
  }
  uVar1 = (uint32_t)uVar3;
  if (sVar5 < resultWordCount) {
    do {
      resultWords[sVar5] = (uint32_t)uVar3;
      sVar5 = sVar5 + 1;
      uVar3 = 0;
      uVar1 = 0;
    } while (resultWordCount != sVar5);
  }
  return uVar1;
}

Assistant:

static uint32_t sysbvm_integer_sumInto(size_t leftWordCount, uint32_t *leftWords, size_t rightWordCount, uint32_t *rightWords, size_t resultWordCount, uint32_t *resultWords)
{
    uint32_t carry = 0;
    
    size_t wordsToSum = leftWordCount > rightWordCount ? leftWordCount : rightWordCount;
    for(size_t i = 0; i < wordsToSum; ++i)
    {
        uint32_t leftWord = i < leftWordCount ? leftWords[i] : 0;
        uint32_t rightWord = i < rightWordCount ? rightWords[i] : 0;

        uint64_t sum = (uint64_t)leftWord + (uint64_t)rightWord + (uint64_t)carry;
        uint32_t sumWord = (uint32_t)sum;
        if(i < resultWordCount)
            resultWords[i] = sumWord;

        carry = (uint32_t)(sum >> 32);
    }

    for(size_t i = wordsToSum; i < resultWordCount; ++i)
    {
        if(i < resultWordCount)
            resultWords[i] = carry;
        carry = 0;
    }

    return carry;
}